

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoCompress.c
# Opt level: O1

void DownHeap(INT32 Index)

{
  short sVar1;
  ushort uVar2;
  UINT16 *pUVar3;
  INT32 IVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  
  IVar4 = mHeapSize;
  pUVar3 = mFreq;
  sVar1 = mHeap[(uint)Index];
  uVar7 = Index * 2;
  if (mHeapSize < (int)uVar7) {
    uVar5 = (ulong)(uint)Index;
  }
  else {
    uVar2 = mFreq[sVar1];
    uVar5 = (ulong)(uint)Index;
    do {
      if ((IVar4 <= (int)uVar7) ||
         (uVar6 = (ulong)(uVar7 | 1), pUVar3[mHeap[uVar7]] <= pUVar3[mHeap[uVar6]])) {
        uVar6 = (ulong)uVar7;
      }
      if (uVar2 <= pUVar3[mHeap[uVar6]]) break;
      mHeap[uVar5] = mHeap[uVar6];
      uVar7 = (int)uVar6 * 2;
      uVar5 = uVar6;
    } while ((int)uVar7 <= IVar4);
  }
  mHeap[uVar5] = sVar1;
  return;
}

Assistant:

STATIC 
VOID 
DownHeap (
  IN INT32 i
  )
{
  INT32 j, k;

  //
  // priority queue: send i-th entry down heap
  //
  
  k = mHeap[i];
  while ((j = 2 * i) <= mHeapSize) {
    if (j < mHeapSize && mFreq[mHeap[j]] > mFreq[mHeap[j + 1]]) {
      j++;
    }
    if (mFreq[k] <= mFreq[mHeap[j]]) {
      break;
    }
    mHeap[i] = mHeap[j];
    i = j;
  }
  mHeap[i] = (INT16)k;
}